

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscTests.cpp
# Opt level: O3

void __thiscall agge::tests::MiscTests::PointsSubtractionProducesVector(MiscTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_70;
  agge_vector<float> local_50;
  agge_vector<float> local_48;
  LocationInfo local_40;
  
  local_48.dx = -72.402;
  local_48.dy = 323.29;
  local_50.dx = -72.402;
  local_50.dy = 323.29;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x85);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(&local_48,&local_50,&local_40);
  paVar2 = &local_40.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_48.dx = 71.0;
  local_48.dy = -11.49;
  local_50.dx = 71.0;
  local_50.dy = -11.490001;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x86);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(&local_48,&local_50,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_48.dx = 1.402;
  local_48.dy = -311.8;
  local_50.dx = 1.4020001;
  local_50.dy = -311.8;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x87);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(&local_48,&local_50,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x89);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x8a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x8b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( PointsSubtractionProducesVector )
			{
				// INIT
				const point_r p1 = { -1.202f, 311.9f }, p2 = { 71.2f, -11.39f }, p3 = { 0.2f, 0.1f };
				const point<int> p4 = { -9, 13 }, p5 = { 911, 1978 }, p6 = { 0, 0 };

				// ACT / ASSERT
				assert_equal(create_vector(-72.402f, 323.29f), p1 - p2);
				assert_equal(create_vector(71.0f, -11.49f), p2 - p3);
				assert_equal(create_vector(1.402f, -311.8f), p3 - p1);

				assert_equal(create_vector(-920, -1965), p4 - p5);
				assert_equal(create_vector(911, 1978), p5 - p6);
				assert_equal(create_vector(9, -13), p6 - p4);
			}